

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcolor.c
# Opt level: O2

void gray_rgb565_convert(j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION input_row,
                        JSAMPARRAY output_buf,int num_rows)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  ushort *puVar4;
  byte *pbVar5;
  long lVar6;
  
  uVar3 = cinfo->output_width;
  while (0 < num_rows) {
    pbVar5 = (*input_buf)[input_row];
    puVar4 = (ushort *)*output_buf;
    if (((ulong)puVar4 & 3) != 0) {
      bVar1 = *pbVar5;
      pbVar5 = pbVar5 + 1;
      *puVar4 = (ushort)(bVar1 >> 3) + (bVar1 & 0xfffc) * 8 | (bVar1 & 0xf8) << 8;
      puVar4 = puVar4 + 1;
      uVar3 = uVar3 - 1;
    }
    num_rows = num_rows + -1;
    input_row = input_row + 1;
    output_buf = output_buf + 1;
    for (lVar6 = 0; uVar3 >> 1 != (uint)lVar6; lVar6 = lVar6 + 1) {
      bVar1 = pbVar5[lVar6 * 2];
      bVar2 = pbVar5[lVar6 * 2 + 1];
      *(uint *)(puVar4 + lVar6 * 2) =
           (uint)(bVar1 >> 3) + (bVar1 & 0xfffffffc) * 8 | (bVar1 & 0xf8) << 8 |
           ((uint)(bVar2 >> 3) | (bVar2 & 0xf8) * 0x100 + (bVar2 & 0xfffffffc) * 8) << 0x10;
    }
    if ((uVar3 & 1) != 0) {
      bVar1 = pbVar5[lVar6 * 2];
      puVar4[lVar6 * 2] = (ushort)(bVar1 >> 3) + (bVar1 & 0xfffc) * 8 | (bVar1 & 0xf8) << 8;
    }
  }
  return;
}

Assistant:

METHODDEF(void)
gray_rgb565_convert(j_decompress_ptr cinfo, JSAMPIMAGE input_buf,
                    JDIMENSION input_row, JSAMPARRAY output_buf, int num_rows)
{
  if (is_big_endian())
    gray_rgb565_convert_be(cinfo, input_buf, input_row, output_buf, num_rows);
  else
    gray_rgb565_convert_le(cinfo, input_buf, input_row, output_buf, num_rows);
}